

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_chlist(exr_context_t ctxt,exr_attribute_t *a)

{
  uint64_t *puVar1;
  exr_attr_chlist_entry_t *peVar2;
  int iVar3;
  exr_result_t eVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint8_t flags [4];
  uint8_t eol;
  int32_t samps [2];
  int32_t ptype;
  uint8_t local_41 [5];
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  lVar8 = (long)((a->field_6).chlist)->num_channels;
  if (lVar8 < 1) {
    uVar7 = 1;
  }
  else {
    lVar9 = 0;
    lVar6 = 0;
    do {
      lVar5 = lVar6 + *(int *)(((a->field_6).chlist)->entries->reserved + lVar9 + -0x15);
      lVar6 = lVar5 + 0x11;
      lVar9 = lVar9 + 0x20;
    } while (lVar8 * 0x20 != lVar9);
    uVar7 = lVar5 + 0x12;
    if ((uVar7 & 0xffffffff80000000) != 0) {
      iVar3 = (*ctxt->standard_error)(ctxt,3);
      goto LAB_00128dc9;
    }
  }
  local_3c = (undefined4)uVar7;
  iVar3 = (*ctxt->do_write)(ctxt,&local_3c,4,&ctxt->output_file_offset);
LAB_00128dc9:
  if (iVar3 == 0) {
    puVar1 = &ctxt->output_file_offset;
    lVar8 = -1;
    lVar6 = 0x1c;
    while( true ) {
      lVar8 = lVar8 + 1;
      if (((a->field_6).chlist)->num_channels <= lVar8) break;
      peVar2 = ((a->field_6).chlist)->entries;
      local_34 = *(undefined4 *)(peVar2->reserved + lVar6 + -0x21);
      local_3c = *(undefined4 *)(peVar2->reserved + lVar6 + -0x19);
      local_38 = *(undefined4 *)(peVar2->reserved + lVar6 + -0x15);
      local_41[0] = peVar2->reserved[lVar6 + -0x1d];
      local_41[3] = 0;
      local_41[1] = '\0';
      local_41[2] = '\0';
      eVar4 = (*ctxt->do_write)(ctxt,*(void **)(peVar2->reserved + lVar6 + -0x29),
                                (long)*(int *)(peVar2->reserved + lVar6 + -0x31) + 1,puVar1);
      if (eVar4 != 0) {
        return eVar4;
      }
      eVar4 = (*ctxt->do_write)(ctxt,&local_34,4,puVar1);
      if (eVar4 != 0) {
        return eVar4;
      }
      eVar4 = (*ctxt->do_write)(ctxt,local_41,4,puVar1);
      if (eVar4 != 0) {
        return eVar4;
      }
      lVar6 = lVar6 + 0x20;
      eVar4 = (*ctxt->do_write)(ctxt,&local_3c,8,puVar1);
      if (eVar4 != 0) {
        return eVar4;
      }
    }
    local_41[4] = 0;
    iVar3 = (*ctxt->do_write)(ctxt,local_41 + 4,1,puVar1);
  }
  return iVar3;
}

Assistant:

static exr_result_t
save_chlist (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    size_t       attrsz = 0;
    int32_t      ptype;
    uint8_t      eol;
    uint8_t      flags[4];
    int32_t      samps[2];

    for (int c = 0; c < a->chlist->num_channels; ++c)
    {
        const exr_attr_chlist_entry_t* centry = a->chlist->entries + c;
        attrsz += (size_t) (centry->name.length + 1);
        attrsz += 16;
    }
    // for end of list marker
    attrsz += 1;

    rv = save_attr_sz (ctxt, attrsz);

    for (int c = 0; rv == EXR_ERR_SUCCESS && c < a->chlist->num_channels; ++c)
    {
        const exr_attr_chlist_entry_t* centry = a->chlist->entries + c;

        ptype    = (int32_t) (centry->pixel_type);
        samps[0] = centry->x_sampling;
        samps[1] = centry->y_sampling;

        flags[0] = centry->p_linear;
        flags[1] = flags[2] = flags[3] = 0;

        priv_from_native32 (&ptype, 1);
        priv_from_native32 (samps, 2);

        rv = ctxt->do_write (
            ctxt,
            centry->name.str,
            (uint64_t) (centry->name.length + 1),
            &(ctxt->output_file_offset));
        if (rv != EXR_ERR_SUCCESS) break;
        rv = ctxt->do_write (
            ctxt, &ptype, sizeof (int32_t), &(ctxt->output_file_offset));
        if (rv != EXR_ERR_SUCCESS) break;
        rv = ctxt->do_write (
            ctxt, flags, sizeof (uint8_t) * 4, &(ctxt->output_file_offset));
        if (rv != EXR_ERR_SUCCESS) break;
        rv = ctxt->do_write (
            ctxt, samps, sizeof (int32_t) * 2, &(ctxt->output_file_offset));
    }
    if (rv == EXR_ERR_SUCCESS)
    {
        eol = 0;
        rv  = ctxt->do_write (
            ctxt, &eol, sizeof (uint8_t), &(ctxt->output_file_offset));
    }
    return rv;
}